

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void __thiscall TileData::TileData(TileData *this,Tile *tile,Palette *palette)

{
  uint16_t uVar1;
  ushort uVar2;
  long lVar3;
  uint32_t y;
  uint32_t y_00;
  
  this->_hash = 0;
  lVar3 = 0;
  for (y_00 = 0; y_00 != 8; y_00 = y_00 + 1) {
    uVar1 = rowBitplanes(tile,palette,y_00);
    (this->_data)._M_elems[lVar3] = (byte)uVar1;
    if (options.bitDepth == '\x02') {
      (this->_data)._M_elems[lVar3 + 1] = (uchar)(uVar1 >> 8);
      lVar3 = lVar3 + 2;
    }
    else {
      lVar3 = lVar3 + 1;
    }
    uVar2 = uVar1 ^ this->_hash;
    this->_hash = uVar2;
    if (options.allowMirroring == true) {
      this->_hash = uVar2 ^ CONCAT11(flipTable._M_elems[uVar1 >> 8],flipTable._M_elems[(byte)uVar1])
      ;
    }
  }
  return;
}

Assistant:

TileData(Png::TilesVisitor::Tile const &tile, Palette const &palette) : _hash(0) {
		size_t writeIndex = 0;
		for (uint32_t y = 0; y < 8; ++y) {
			uint16_t bitplanes = rowBitplanes(tile, palette, y);
			_data[writeIndex++] = bitplanes & 0xFF;
			if (options.bitDepth == 2) {
				_data[writeIndex++] = bitplanes >> 8;
			}

			// Update the hash
			_hash ^= bitplanes;
			if (options.allowMirroring) {
				// Count the line itself as mirrorred; vertical mirroring is
				// already taken care of because the symmetric line will be XOR'd
				// the same way. (...which is a problem, but probably benign.)
				_hash ^= flipTable[bitplanes >> 8] << 8 | flipTable[bitplanes & 0xFF];
			}
		}
	}